

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O2

bool __thiscall
crnlib::
hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
::insert_no_grow(hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
                 *this,insert_result *result,vec<6U,_float> *k,uint *v)

{
  raw_node *prVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  float *this_00;
  
  if ((this->m_values).m_size == 0) {
    return false;
  }
  uVar4 = hash_key(this,k);
  prVar1 = (this->m_values).m_p;
  this_00 = (float *)(prVar1 + uVar4);
  uVar5 = uVar4;
  if (prVar1[uVar4].m_bits[0x1c] == '\0') {
LAB_001711c5:
    if (this->m_grow_threshold <= this->m_num_valid) {
      return false;
    }
    *(undefined8 *)(this_00 + 4) = *(undefined8 *)(k->m_s + 4);
    uVar2 = *(undefined8 *)(k->m_s + 2);
    *(undefined8 *)this_00 = *(undefined8 *)k->m_s;
    *(undefined8 *)(this_00 + 2) = uVar2;
    this_00[6] = (float)*v;
    *(undefined1 *)(this_00 + 7) = 1;
    this->m_num_valid = this->m_num_valid + 1;
    bVar3 = true;
  }
  else {
    bVar3 = vec<6U,_float>::operator==((vec<6U,_float> *)this_00,k);
    if (bVar3) {
      bVar3 = false;
    }
    else {
      uVar6 = (ulong)uVar4;
      do {
        if ((int)uVar6 == 0) {
          uVar6 = (ulong)((this->m_values).m_size - 1);
          this_00 = (float *)((this->m_values).m_p + uVar6);
        }
        else {
          uVar6 = (ulong)((int)uVar6 - 1);
          this_00 = this_00 + -8;
        }
        uVar5 = (uint)uVar6;
        if (uVar4 == uVar5) {
          return false;
        }
        if (*(char *)(this_00 + 7) == '\0') goto LAB_001711c5;
        bVar3 = vec<6U,_float>::operator==((vec<6U,_float> *)this_00,k);
      } while (!bVar3);
      bVar3 = false;
    }
  }
  (result->first).m_pTable = this;
  (result->first).m_index = uVar5;
  result->second = bVar3;
  return true;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value()) {
    if (!m_values.size())
      return false;

    int index = hash_key(k);
    node* pNode = &get_node(index);

    if (pNode->state) {
      if (m_equals(pNode->first, k)) {
        result.first = iterator(*this, index);
        result.second = false;
        return true;
      }

      const int orig_index = index;

      for (;;) {
        if (!index) {
          index = m_values.size() - 1;
          pNode = &get_node(index);
        } else {
          index--;
          pNode--;
        }

        if (orig_index == index)
          return false;

        if (!pNode->state)
          break;

        if (m_equals(pNode->first, k)) {
          result.first = iterator(*this, index);
          result.second = false;
          return true;
        }
      }
    }

    if (m_num_valid >= m_grow_threshold)
      return false;

    construct_value_type(pNode, k, v);

    pNode->state = cStateValid;

    m_num_valid++;
    CRNLIB_ASSERT(m_num_valid <= m_values.size());

    result.first = iterator(*this, index);
    result.second = true;

    return true;
  }